

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::PartialUpdateTest::deinit(PartialUpdateTest *this)

{
  GLES2Renderer *this_00;
  Library *pLVar1;
  Library *egl;
  PartialUpdateTest *this_local;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if (this->m_refRenderer != (ReferenceRenderer *)0x0) {
    operator_delete(this->m_refRenderer,1);
  }
  this->m_refRenderer = (ReferenceRenderer *)0x0;
  this_00 = this->m_gles2Renderer;
  if (this_00 != (GLES2Renderer *)0x0) {
    GLES2Renderer::~GLES2Renderer(this_00);
    operator_delete(this_00,0xe0);
  }
  this->m_gles2Renderer = (GLES2Renderer *)0x0;
  if (this->m_eglContext != (EGLContext)0x0) {
    (*pLVar1->_vptr_Library[0x27])(pLVar1,this->m_eglDisplay,0,0);
    (*pLVar1->_vptr_Library[0x13])(pLVar1,this->m_eglDisplay,this->m_eglContext);
    this->m_eglContext = (EGLContext)0x0;
  }
  if (this->m_eglSurface != (EGLSurface)0x0) {
    (*pLVar1->_vptr_Library[0x16])(pLVar1,this->m_eglDisplay,this->m_eglSurface);
    this->m_eglSurface = (EGLSurface)0x0;
  }
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_eglDisplay);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  this->m_window = (NativeWindow *)0x0;
  return;
}

Assistant:

void PartialUpdateTest::deinit (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	delete m_refRenderer;
	m_refRenderer = DE_NULL;

	delete m_gles2Renderer;
	m_gles2Renderer = DE_NULL;

	if (m_eglContext != EGL_NO_CONTEXT)
	{
		egl.makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		egl.destroyContext(m_eglDisplay, m_eglContext);
		m_eglContext = EGL_NO_CONTEXT;
	}

	if (m_eglSurface != EGL_NO_SURFACE)
	{
		egl.destroySurface(m_eglDisplay, m_eglSurface);
		m_eglSurface = EGL_NO_SURFACE;
	}

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		egl.terminate(m_eglDisplay);
		m_eglDisplay = EGL_NO_DISPLAY;
	}

	delete m_window;
	m_window = DE_NULL;
}